

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_libapi.cpp
# Opt level: O0

ze_result_t
zeCommandQueueCreate
          (ze_context_handle_t hContext,ze_device_handle_t hDevice,ze_command_queue_desc_t *desc,
          ze_command_queue_handle_t *phCommandQueue)

{
  ze_pfnCommandQueueCreate_t p_Var1;
  __pointer_type p_Var2;
  ze_pfnCommandQueueCreate_t pfnCreate;
  ze_command_queue_handle_t *phCommandQueue_local;
  ze_command_queue_desc_t *desc_local;
  ze_device_handle_t hDevice_local;
  ze_context_handle_t hContext_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_ze_dditable_t_*>::load
                       ((atomic<_ze_dditable_t_*> *)(ze_lib::context + 0x10),memory_order_seq_cst);
    p_Var1 = (p_Var2->CommandQueue).pfnCreate;
    if (p_Var1 == (ze_pfnCommandQueueCreate_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hContext_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hContext_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hContext_local._4_4_ = (*p_Var1)(hContext,hDevice,desc,phCommandQueue);
    }
  }
  else {
    hContext_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hContext_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zeCommandQueueCreate(
    ze_context_handle_t hContext,                   ///< [in] handle of the context object
    ze_device_handle_t hDevice,                     ///< [in] handle of the device object
    const ze_command_queue_desc_t* desc,            ///< [in] pointer to command queue descriptor
    ze_command_queue_handle_t* phCommandQueue       ///< [out] pointer to handle of command queue object created
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const ze_pfnCommandQueueCreate_t pfnCreate = [&result] {
        auto pfnCreate = ze_lib::context->zeDdiTable.load()->CommandQueue.pfnCreate;
        if( nullptr == pfnCreate ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnCreate;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnCreate( hContext, hDevice, desc, phCommandQueue );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnCreate = ze_lib::context->zeDdiTable.load()->CommandQueue.pfnCreate;
    if( nullptr == pfnCreate ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnCreate( hContext, hDevice, desc, phCommandQueue );
    #endif
}